

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSum.cpp
# Opt level: O2

int __thiscall
NaPNSum::verify(NaPNSum *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  NaVector *pNVar5;
  NaVector *pNVar6;
  char *pcVar7;
  
  pNVar5 = NaPetriCnInput::data(&this->aux);
  uVar1 = (*pNVar5->_vptr_NaVector[6])(pNVar5);
  pNVar5 = &this->vAuxGain;
  uVar2 = NaVector::dim(pNVar5);
  if (uVar1 == uVar2) {
    uVar1 = NaVector::dim(pNVar5);
    if (uVar1 == 0) goto LAB_001424c7;
    pNVar6 = NaPetriCnInput::data(&this->main);
    uVar1 = (*pNVar6->_vptr_NaVector[6])(pNVar6);
    uVar2 = NaVector::dim(&this->vMainGain);
    if (uVar1 != uVar2) goto LAB_001424c7;
    uVar1 = NaVector::dim(&this->vMainGain);
    if (uVar1 == 0) goto LAB_001424c7;
LAB_0014251e:
    pNVar5 = NaPetriCnInput::data(&this->main);
    iVar3 = (*pNVar5->_vptr_NaVector[6])(pNVar5);
    pNVar5 = NaPetriCnInput::data(&this->aux);
    iVar4 = (*pNVar5->_vptr_NaVector[6])(pNVar5);
    if (iVar3 == iVar4) {
      pNVar5 = NaPetriCnInput::data(&this->main);
      iVar3 = (*pNVar5->_vptr_NaVector[6])(pNVar5);
      pNVar5 = NaPetriCnOutput::data(&this->sum);
      iVar4 = (*pNVar5->_vptr_NaVector[6])(pNVar5);
      iVar3 = (int)CONCAT71((int7)((ulong)&this->sum >> 8),iVar3 == iVar4);
    }
    else {
      iVar3 = 0;
    }
  }
  else {
LAB_001424c7:
    uVar1 = NaVector::dim(pNVar5);
    if (uVar1 == 1) {
      uVar1 = NaVector::dim(&this->vMainGain);
      if (uVar1 == 1) goto LAB_0014251e;
    }
    uVar1 = NaVector::dim(pNVar5);
    if (uVar1 == 0) {
      uVar1 = NaVector::dim(&this->vMainGain);
      if (uVar1 == 0) goto LAB_0014251e;
    }
    pcVar7 = NaPetriNode::name(&this->super_NaPetriNode);
    iVar3 = 0;
    NaPrintLog("Node \'%s\' has mismatched gain dimension\n",pcVar7);
  }
  return iVar3;
}

Assistant:

bool
NaPNSum::verify ()
{
  /* check gain dimension */
  bool	bGoodGain =
    (aux.data().dim() == vAuxGain.dim() && 0 != vAuxGain.dim() &&
     main.data().dim() == vMainGain.dim() && 0 != vMainGain.dim()) ||
    (1 == vAuxGain.dim() && 1 == vMainGain.dim()) ||
    (0 == vAuxGain.dim() && 0 == vMainGain.dim());

  if(!bGoodGain)
    NaPrintLog("Node '%s' has mismatched gain dimension\n", name());

  return bGoodGain
    && main.data().dim() == aux.data().dim()
    && main.data().dim() == sum.data().dim();
}